

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eventfd-uni.c
# Opt level: O1

int main(int argc,char **argv)

{
  int descriptor;
  Arguments args;
  Arguments local_10;
  
  parse_arguments(&local_10,argc,argv);
  descriptor = eventfd(0,0);
  communicate(descriptor,&local_10);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
	// An eventfd object is simply a file in the file-system, that can
	// be used as a wait/notify-mechanism similar to a semaphore. It
	// is associated with a standard file descriptor and thus the
	// usual read() and write() functions can be used, albeit their
	// behaviour is different than for standard files.
	// Stored in the eventfd itself is a simple 64-bit/8-Byte integer.
	int descriptor;

	struct Arguments args;
	parse_arguments(&args, argc, argv);

	// Create a new eventfd object and get the corresponding
	// file descriptor. The first argument is the initial value,
	// which we just set to 0 here and the second argument are
	// any flags (a bitwise-OR combination thereof), such as:
	// EFD_NONBLOCK: Causes read() and write() to return immdediately
	//               where the calls would normally block. In that case,
	//               the return code is EAGAIN.
	// EFD_SEMAPHORE: Causes reads to always return a value of 1 and
	//                decrement the value stored in the eventfd by 1.
	descriptor = eventfd(0, 0);

	communicate(descriptor, &args);

	return EXIT_SUCCESS;
}